

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void t1_dec_refpass_step(opj_t1_t *t1,flag_t *flagsp,OPJ_INT32 *datap,OPJ_INT32 poshalf,
                        OPJ_INT32 neghalf,OPJ_BYTE type,OPJ_UINT32 vsc)

{
  long lVar1;
  opj_raw_t *raw_00;
  int iVar2;
  opj_mqc_t *mqc_00;
  int in_ECX;
  int *in_RDX;
  ushort *in_RSI;
  long in_RDI;
  int in_R8D;
  char in_R9B;
  int in_stack_00000008;
  opj_raw_t *raw;
  opj_mqc_t *mqc;
  OPJ_UINT32 flag;
  OPJ_UINT32 v;
  OPJ_INT32 t;
  int local_58;
  int local_54;
  uint local_44;
  int local_2c;
  
  lVar1 = *(long *)(in_RDI + 8);
  raw_00 = *(opj_raw_t **)(in_RDI + 0x10);
  if (in_stack_00000008 == 0) {
    local_44 = (uint)(short)*in_RSI;
  }
  else {
    local_44 = (int)(short)*in_RSI & 0xfffffbb9;
  }
  if ((local_44 & 0x5000) == 0x1000) {
    mqc_00 = (opj_mqc_t *)(lVar1 + 0x28);
    iVar2 = t1_getctxno_mag(local_44);
    *(opj_mqc_state_t ***)(lVar1 + 0xc0) = mqc_00->ctxs + (long)iVar2 + -5;
    if (in_R9B == '\x01') {
      local_2c = raw_decode(raw_00);
    }
    else {
      local_2c = mqc_decode(mqc_00);
    }
    local_54 = in_R8D;
    if (local_2c != 0) {
      local_54 = in_ECX;
    }
    if (*in_RDX < 0) {
      local_58 = -local_54;
    }
    else {
      local_58 = local_54;
    }
    *in_RDX = local_58 + *in_RDX;
    *in_RSI = *in_RSI | 0x2000;
  }
  return;
}

Assistant:

static void t1_dec_refpass_step(
		opj_t1_t *t1,
		flag_t *flagsp,
		OPJ_INT32 *datap,
		OPJ_INT32 poshalf,
		OPJ_INT32 neghalf,
		OPJ_BYTE type,
		OPJ_UINT32 vsc)
{
	OPJ_INT32  t;
	OPJ_UINT32 v,flag;

	opj_mqc_t *mqc = t1->mqc;	/* MQC component */
	opj_raw_t *raw = t1->raw;	/* RAW component */

	flag = vsc ? ((*flagsp) & (~(T1_SIG_S | T1_SIG_SE | T1_SIG_SW | T1_SGN_S))) : (*flagsp);
	if ((flag & (T1_SIG | T1_VISIT)) == T1_SIG) {
		mqc_setcurctx(mqc, t1_getctxno_mag(flag));	/* ESSAI */
		if (type == T1_TYPE_RAW) {
			v = raw_decode(raw);
		} else {
			v = mqc_decode(mqc);
		}
		t = v ? poshalf : neghalf;
		*datap += *datap < 0 ? -t : t;
		*flagsp |= T1_REFINE;
	}
}